

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void handleSelection(char type,int selection)

{
  ostream *poVar1;
  char *pcVar2;
  string *this;
  allocator<char> local_429;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if ((type & 0xdfU) == 0x44) {
    switch(selection + -1) {
    case 0:
      poVar1 = std::operator<<((ostream *)&std::cout,"/* #1 Removal of Trigraphs */");
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/1/trigraphs.cpp.";
      break;
    case 1:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #2 Removal of deprecated Increment Operator(++) for bool type */"
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/2/bool++_dep.cpp.";
      break;
    case 2:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #3 Removal of deprecated register keyword */");
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/3/register.cpp.";
      break;
    case 3:
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "/* #4 Removal of deprecated Dynamic Exception Specifications */");
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "Please see the source file located at ~/CPlusPlus17/src/old/4/dynam_except.cpp.";
      break;
    default:
      goto switchD_001027fc_default;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Compile against -std=c++14 to build.");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  switch(selection + -1) {
  case 0:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #1 Addition of __has_include macro */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/1/hasinclude.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"new/1/hasinclude",&local_429);
    runNix(&local_28);
    this = &local_28;
    break;
  case 1:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #2 UTF 8 Character Literals */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/2/utf8.cpp.");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"new/2/utf8",&local_429);
    runNix(&local_48);
    this = &local_48;
    break;
  case 2:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #3 Hexadecimal Floating Point Literals */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/3/hex.cpp.");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"new/3/hex",&local_429);
    runNix(&local_68);
    this = &local_68;
    break;
  case 3:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #4 New rules for deduction of single member list using auto */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/4/auto_deduc.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"new/4/auto_deduc",&local_429);
    runNix(&local_88);
    this = &local_88;
    break;
  case 4:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #5 Update to __cplusplus value */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/5/cppvc.cpp.");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"new/5/cppvc",&local_429)
    ;
    runNix(&local_a8);
    this = &local_a8;
    break;
  case 5:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #6 Inline variables */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/6/inline.cpp.");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"new/6/inline",&local_429);
    runNix(&local_c8);
    this = &local_c8;
    break;
  case 6:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #7 New Syntax for Nested Namespace definitions */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/7/namespace.cpp.")
    ;
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"new/7/namespace",&local_429);
    runNix(&local_e8);
    this = &local_e8;
    break;
  case 7:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #8  Initializers added to if/switch statements */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/8/init_if_sw.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"new/8/init_if_sw",&local_429);
    runNix(&local_108);
    this = &local_108;
    break;
  case 8:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #9 constexpr if */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/9/constexpr_if.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"new/9/constexpr_if",&local_429);
    runNix(&local_128);
    this = &local_128;
    break;
  case 9:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #10 New standard attributes [[fallthrough]], [[maybe_unused]] & [[nodiscard]] */"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/10/attributes.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"new/10/attributes",&local_429);
    runNix(&local_148);
    this = &local_148;
    break;
  case 10:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #11 Attributes for Enumerator & Namespaces */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/11/attributes2.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"new/11/attributes2",&local_429);
    runNix(&local_168);
    this = &local_168;
    break;
  case 0xb:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #12 Error message for static_assert now optional */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/12/static_assert.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"new/12/static_assert",&local_429);
    runNix(&local_188);
    this = &local_188;
    break;
  case 0xc:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #13 Structured binding declarations */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/13/tuple_pack.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"new/134/tuple_pack",&local_429);
    runNix(&local_1a8);
    this = &local_1a8;
    break;
  case 0xd:
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_28e3);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/14/templ_param.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"new/14/templ_param",&local_429);
    runNix(&local_1c8);
    this = &local_1c8;
    break;
  case 0xe:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #15 Constant evaluation for non-type template arguments */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/15/const_nontype.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"new/15/const_nontype",&local_429);
    runNix(&local_1e8);
    this = &local_1e8;
    break;
  case 0xf:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #16 Class template argument deduction */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/16/temp_arg_deduc.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"new/16/temp_arg_deduc",&local_429);
    runNix(&local_208);
    this = &local_208;
    break;
  case 0x10:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #17 Extensions on over-aligned Memory Allocation */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/17/over_align.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"new/17/over_align",&local_429);
    runNix(&local_228);
    this = &local_228;
    break;
  case 0x11:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #18 Fold Expressions */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/18/fold_expr.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"new/18/fold_expr",&local_429);
    runNix(&local_248);
    this = &local_248;
    break;
  case 0x12:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #19 List-style Initialization of Enumerations */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/19/enum_list.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"new/19/enum_list",&local_429);
    runNix(&local_268);
    this = &local_268;
    break;
  case 0x13:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #20 Specifying non-type template parameters with auto */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/20/auto_temp.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"new/20/auto_temp",&local_429);
    runNix(&local_288);
    this = &local_288;
    break;
  case 0x14:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #21  constexpr lambda expressions */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/21/constexpr_lambda.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"new/21/constexpr_lambda",&local_429);
    runNix(&local_2a8);
    this = &local_2a8;
    break;
  case 0x15:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #22 Lambda this by value (*this) */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/22/lambda_this.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"new/22/lambda_this",&local_429);
    runNix(&local_2c8);
    this = &local_2c8;
    break;
  case 0x16:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #23 Extending Aggregate Initialization to Base Types */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/23/aggregate.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"new/23/aggregate",&local_429);
    runNix(&local_2e8);
    this = &local_2e8;
    break;
  case 0x17:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #24 Unknown Attributes Required to be Ignored */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/24/unknw_attr.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"new/24/unknw_attr",&local_429);
    runNix(&local_308);
    this = &local_308;
    break;
  case 0x18:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #25 Pack Expansions legal in using declarations */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/25/using_pack.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"new/25/using_pack",&local_429);
    runNix(&local_328);
    this = &local_328;
    break;
  case 0x19:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #26 Generalization of Range-based for loop */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/26/range_for.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"new/26/range_for",&local_429);
    runNix(&local_348);
    this = &local_348;
    break;
  case 0x1a:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #27 The byte data type */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/27/byte.cpp.");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"new/27/byte",&local_429);
    runNix(&local_368);
    this = &local_368;
    break;
  case 0x1b:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #28 Using attribute namespaces without repetition */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/28/using_attr.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"new/28/using_attr",&local_429);
    runNix(&local_388);
    this = &local_388;
    break;
  case 0x1c:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #29 Stricter Order of Evaluation Rules */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Please see the text file located at ~/CPlusPlus17/src/new/29/eval_order.txt."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"new/29/eval_order.txt",&local_429);
    runNix(&local_3a8);
    this = &local_3a8;
    break;
  case 0x1d:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #30 Exception Specifications are part of type definitions */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/30/throw_type.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"new/30/throw_type",&local_429);
    runNix(&local_3c8);
    this = &local_3c8;
    break;
  case 0x1e:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #31 Template-Template Parameters match compatible arguments */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The source file is located at ~/CPlusPlus17/src/new/31/templ_match.cpp."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"new/31/templ_match",&local_429);
    runNix(&local_3e8);
    this = &local_3e8;
    break;
  case 0x1f:
    poVar1 = std::operator<<((ostream *)&std::cout,"/* #31 Guaranteed Copy Elision */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Please see the text file located at~/CPlusPlus17/src/new/32/templ_match.txt"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"new/32/templ_match.txt",&local_429);
    runNix(&local_408);
    this = &local_408;
    break;
  case 0x20:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/* #33 Changes to Specification on Inheriting Constructors */");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Please see the text file located at~/CPlusPlus17/src/new/33/using_constr.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    if (isWindows != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"new/33/using_constr",&local_429);
    runNix(&local_428);
    this = &local_428;
    break;
  default:
    goto switchD_001027fc_default;
  }
  std::__cxx11::string::~string((string *)this);
switchD_001027fc_default:
  return;
}

Assistant:

void handleSelection (char type, int selection) {
	//Old Language Features
	if (type == 'D' || type == 'd' ){
		switch (selection) {
			case 1:
				cout << "/* #1 Removal of Trigraphs */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/1/trigraphs.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
			case 2:
				cout << "/* #2 Removal of deprecated Increment Operator(++) for bool type */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/2/bool++_dep.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
			case 3:
				cout << "/* #3 Removal of deprecated register keyword */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/3/register.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;				
				break;
			case 4:
				cout << "/* #4 Removal of deprecated Dynamic Exception Specifications */" << endl;
				cout << "Please see the source file located at ~/CPlusPlus17/src/old/4/dynam_except.cpp." << endl;
				cout << "Compile against -std=c++14 to build." << endl;
				break;
		}
	}
	//New Language Features
	else {
		switch(selection){
			case 1:
				cout << "/* #1 Addition of __has_include macro */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/1/hasinclude.cpp." << endl;
				if (isWindows)
					runWin32Process("new/1/hasinclude");
				else
					runNix("new/1/hasinclude");
				break;
			case 2:
				cout << "/* #2 UTF 8 Character Literals */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/2/utf8.cpp." << endl;
				if (isWindows)
					runWin32Process("new/2/utf8");
				else
					runNix("new/2/utf8");
				break;
			case 3:
				cout << "/* #3 Hexadecimal Floating Point Literals */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/3/hex.cpp." << endl;
				if (isWindows)
					runWin32Process("new/3/hex");
				else
					runNix("new/3/hex");
				break;
			case 4:
				cout << "/* #4 New rules for deduction of single member list using auto */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/4/auto_deduc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/4/auto_deduc");
				else
					runNix("new/4/auto_deduc");
				break;
			case 5:
				cout << "/* #5 Update to __cplusplus value */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/5/cppvc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/5/cppvc");
				else
					runNix("new/5/cppvc");
				break;
			case 6:
				cout << "/* #6 Inline variables */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/6/inline.cpp." << endl;
				if (isWindows)
					runWin32Process("new/6/inline");
				else
					runNix("new/6/inline");
				break;
			case 7:
				cout << "/* #7 New Syntax for Nested Namespace definitions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/7/namespace.cpp." << endl;
				if (isWindows)
					runWin32Process("new/7/namespace");
				else
					runNix("new/7/namespace");
				break;
			case 8:
				cout << "/* #8  Initializers added to if/switch statements */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/8/init_if_sw.cpp." << endl;
				if (isWindows)
					runWin32Process("new/8/init_if_sw");
				else
					runNix("new/8/init_if_sw");
				break;
			case 9:
				cout << "/* #9 constexpr if */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/9/constexpr_if.cpp." << endl;
				if (isWindows)
					runWin32Process("new/9/constexpr_if");
				else
					runNix("new/9/constexpr_if");
				break;
			case 10:
				cout << "/* #10 New standard attributes [[fallthrough]], [[maybe_unused]] & [[nodiscard]] */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/10/attributes.cpp." << endl;
				if (isWindows)
					runWin32Process("new/10/attributes");
				else
					runNix("new/10/attributes");
				break;
			case 11:
				cout << "/* #11 Attributes for Enumerator & Namespaces */"<< endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/11/attributes2.cpp." << endl;
				if (isWindows)
					runWin32Process("new/11/attributes2");
				else
					runNix("new/11/attributes2");
				break;
			case 12:
				cout << "/* #12 Error message for static_assert now optional */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/12/static_assert.cpp." << endl;
				if (isWindows)
					runWin32Process("new/12/static_assert");
				else
					runNix("new/12/static_assert");
				break;
			case 13:
				cout << "/* #13 Structured binding declarations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/13/tuple_pack.cpp." << endl;
				if (isWindows)
					runWin32Process("new/13/tuple_pack");
				else
					runNix("new/134/tuple_pack");
				break;
			case 14:
				cout << "/* #14 Keyword typename now allowed in lieu of class in a template’s template paramater */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/14/templ_param.cpp." << endl;
				if (isWindows)
					runWin32Process("new/14/templ_param");
				else
					runNix("new/14/templ_param");
				break;
			case 15:
				cout << "/* #15 Constant evaluation for non-type template arguments */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/15/const_nontype.cpp." << endl;
				if (isWindows)
					runWin32Process("new/15/const_nontype");
				else
					runNix("new/15/const_nontype");
				break;
			case 16:
				cout << "/* #16 Class template argument deduction */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/16/temp_arg_deduc.cpp." << endl;
				if (isWindows)
					runWin32Process("new/16/temp_arg_deduc");
				else
					runNix("new/16/temp_arg_deduc");
				break;
			case 17:
				cout << "/* #17 Extensions on over-aligned Memory Allocation */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/17/over_align.cpp." << endl;
				if (isWindows)
					runWin32Process("new/17/over_align");
				else
					runNix("new/17/over_align");
				break;
			case 18:
				cout << "/* #18 Fold Expressions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/18/fold_expr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/18/fold_expr");
				else
					runNix("new/18/fold_expr");
				break;
			case 19:
				cout << "/* #19 List-style Initialization of Enumerations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/19/enum_list.cpp." << endl;
				if (isWindows)
					runWin32Process("new/19/enum_list");
				else
					runNix("new/19/enum_list");
				break;
			case 20:
				cout << "/* #20 Specifying non-type template parameters with auto */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/20/auto_temp.cpp." << endl;
				if (isWindows)
					runWin32Process("new/20/auto_temp");
				else
					runNix("new/20/auto_temp");
				break;
			case 21:
				cout << "/* #21  constexpr lambda expressions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/21/constexpr_lambda.cpp." << endl;
				if (isWindows)
					runWin32Process("new/21/constexpr_lambda");
				else
					runNix("new/21/constexpr_lambda");
				break;
			case 22:
				cout << "/* #22 Lambda this by value (*this) */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/22/lambda_this.cpp." << endl;
				if (isWindows)
					runWin32Process("new/22/lambda_this");
				else
					runNix("new/22/lambda_this");
				break;
			case 23:
				cout << "/* #23 Extending Aggregate Initialization to Base Types */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/23/aggregate.cpp." << endl;
				if (isWindows)
					runWin32Process("new/23/aggregate");
				else
					runNix("new/23/aggregate");
				break;
			case 24:
				cout << "/* #24 Unknown Attributes Required to be Ignored */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/24/unknw_attr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/24/unknw_attr");
				else
					runNix("new/24/unknw_attr");
				break;
			case 25:
				cout << "/* #25 Pack Expansions legal in using declarations */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/25/using_pack.cpp." << endl;
				if (isWindows)
					runWin32Process("new/25/using_pack");
				else
					runNix("new/25/using_pack");
				break;
			case 26:
				cout << "/* #26 Generalization of Range-based for loop */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/26/range_for.cpp." << endl;
				if (isWindows)
					runWin32Process("new/26/range_for");
				else
					runNix("new/26/range_for");
				break;
			case 27:
				cout << "/* #27 The byte data type */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/27/byte.cpp." << endl;
				if (isWindows)
					runWin32Process("new/27/byte");
				else
					runNix("new/27/byte");
				break;
			case 28:
				cout << "/* #28 Using attribute namespaces without repetition */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/28/using_attr.cpp." << endl;
				if (isWindows)
					runWin32Process("new/28/using_attr");
				else
					runNix("new/28/using_attr");
				break;
			case 29:
				cout << "/* #29 Stricter Order of Evaluation Rules */" << endl;
				cout << "Please see the text file located at ~/CPlusPlus17/src/new/29/eval_order.txt." << endl;
				if (isWindows)
					runWin32Process("new/29/eval_order.txt");
				else
					runNix("new/29/eval_order.txt");
				break;
			case 30:
				cout << "/* #30 Exception Specifications are part of type definitions */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/30/throw_type.cpp." << endl;
				if (isWindows)
					runWin32Process("new/30/throw_type");
				else
					runNix("new/30/throw_type");
				break;
			case 31:
				cout << "/* #31 Template-Template Parameters match compatible arguments */" << endl;
				cout << "The source file is located at ~/CPlusPlus17/src/new/31/templ_match.cpp." << endl;
				if (isWindows)
					runWin32Process("new/31/templ_match");
				else
					runNix("new/31/templ_match");
				break;
			case 32:
				cout << "/* #31 Guaranteed Copy Elision */" << endl;
				cout << "Please see the text file located at~/CPlusPlus17/src/new/32/templ_match.txt" << endl;
				if (isWindows)
					runWin32Process("new/32/templ_match.txt");
				else
					runNix("new/32/templ_match.txt");
				break;
			case 33:
				cout << "/* #33 Changes to Specification on Inheriting Constructors */" << endl;
				cout << "Please see the text file located at~/CPlusPlus17/src/new/33/using_constr.cpp" << endl;
				if (isWindows)
					runWin32Process("new/33/using_constr");
				else
					runNix("new/33/using_constr");
				break;
		}
	}
}